

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::
         do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>
                   (appender out,decimal_fp<float> *f,format_specs<char> *specs,float_specs fspecs,
                   locale_ref loc)

{
  locale_ref loc_00;
  appender out_00;
  appender out_01;
  appender out_02;
  appender out_03;
  char cVar1;
  bool bVar2;
  type tVar3;
  int iVar4;
  appender *paVar5;
  float_specs in_RCX;
  int *in_RDX;
  undefined4 *in_RSI;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_RDI;
  undefined8 in_R8;
  bool pointy;
  int num_zeros;
  digit_grouping<char> grouping_1;
  int num_zeros_3;
  digit_grouping<char> grouping;
  int num_zeros_2;
  int exp;
  anon_class_28_8_ad0ecca5 write;
  char exp_char;
  int exp_digits;
  int abs_output_exp;
  int num_zeros_1;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  int output_exp;
  char decimal_point;
  size_t size;
  sign_t sign;
  char zero;
  int significand_size;
  significand_type significand;
  undefined4 in_stack_fffffffffffffd70;
  undefined3 uVar6;
  undefined4 in_stack_fffffffffffffd74;
  size_t in_stack_fffffffffffffd78;
  format_specs<char> *in_stack_fffffffffffffd80;
  format_specs<char> *specs_00;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  int local_26c;
  undefined8 in_stack_fffffffffffffd98;
  digit_grouping<char> *in_stack_fffffffffffffda0;
  digit_grouping<char> *this;
  undefined1 local_251;
  undefined4 in_stack_fffffffffffffdb4;
  undefined4 uVar8;
  undefined1 localized;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_stack_fffffffffffffdb8;
  locale_ref in_stack_fffffffffffffdc0;
  int local_204;
  format_specs<char> local_1b0 [4];
  int local_16c;
  char *local_168;
  undefined4 *local_160;
  int *local_158;
  undefined4 *local_150;
  digit_grouping<char> *local_148;
  float_specs *local_140;
  char *local_138;
  int *local_130;
  char *local_128;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_120;
  undefined8 local_108;
  digit_grouping<char> local_100;
  int local_c0;
  int local_bc;
  buffer<char> *local_b8;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_b0;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_a8;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_a0;
  char local_94;
  undefined4 local_90;
  int local_8c;
  char local_88;
  int local_84;
  undefined1 local_80;
  undefined1 local_7f;
  int local_7c;
  undefined1 local_75;
  undefined4 local_74;
  int local_70;
  int local_6c;
  anon_class_12_2_f0c9b3c6 local_68;
  int local_5c;
  undefined8 local_58;
  char local_49;
  ulong local_48;
  char local_3a [2];
  int local_38;
  undefined4 local_34;
  int *local_30;
  undefined4 *local_28;
  undefined8 local_20;
  float_specs local_18;
  appender local_10;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_8;
  uint uVar7;
  
  iVar4 = (int)((ulong)in_stack_fffffffffffffd98 >> 0x20);
  local_34 = *in_RSI;
  local_30 = in_RDX;
  local_28 = in_RSI;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
       (back_insert_iterator<fmt::v10::detail::buffer<char>_>)in_RDI.container;
  local_38 = get_significand_size<float>((decimal_fp<float> *)0x1bdb6d);
  local_3a[1] = 0x30;
  local_3a[0] = local_18._5_1_;
  tVar3 = to_unsigned<int>(0);
  local_48 = (ulong)(tVar3 + (local_3a[0] != '\0'));
  if (((uint)local_18._4_4_ >> 0x11 & 1) == 0) {
    uVar8 = CONCAT13(0x2e,(int3)in_stack_fffffffffffffdb4);
  }
  else {
    local_58 = local_20;
    loc_00.locale_._4_4_ = in_stack_fffffffffffffd74;
    loc_00.locale_._0_4_ = in_stack_fffffffffffffd70;
    cVar1 = decimal_point<char>(loc_00);
    uVar8 = CONCAT13(cVar1,(int3)in_stack_fffffffffffffdb4);
  }
  local_49 = (char)((uint)uVar8 >> 0x18);
  local_68.output_exp = local_28[1] + local_38 + -1;
  local_68.fspecs = local_18;
  local_5c = local_68.output_exp;
  bVar2 = do_write_float<fmt::v10::appender,_fmt::v10::detail::dragonbox::decimal_fp<float>,_char,_fmt::v10::detail::digit_grouping<char>_>
          ::anon_class_12_2_f0c9b3c6::operator()(&local_68);
  if (bVar2) {
    local_6c = 0;
    if (((uint)local_18._4_4_ >> 0x13 & 1) == 0) {
      if (local_38 == 1) {
        local_49 = '\0';
      }
    }
    else {
      local_6c = local_18.precision - local_38;
      if (local_6c < 0) {
        local_6c = 0;
      }
      tVar3 = to_unsigned<int>(0);
      local_48 = tVar3 + local_48;
    }
    iVar4 = local_5c;
    if (local_5c < 0) {
      iVar4 = -local_5c;
    }
    local_74 = 2;
    if ((99 < iVar4) && (local_74 = 3, 999 < iVar4)) {
      local_74 = 4;
    }
    local_70 = iVar4;
    tVar3 = to_unsigned<int>(0);
    local_48 = tVar3 + local_48;
    local_251 = 0x45;
    if ((local_18._4_4_ & 0x10000) == 0) {
      local_251 = 0x65;
    }
    local_75 = local_251;
    local_94 = local_3a[0];
    local_90 = local_34;
    local_8c = local_38;
    local_88 = local_49;
    local_84 = local_6c;
    local_80 = 0x30;
    local_7f = local_251;
    local_7c = local_5c;
    if (*local_30 < 1) {
      local_a8 = local_10.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
      paVar5 = reserve<fmt::v10::appender>(&local_10,local_48);
      local_b8 = (paVar5->super_back_insert_iterator<fmt::v10::detail::buffer<char>_>).container;
      local_b0.container =
           (buffer<char> *)
           do_write_float<fmt::v10::appender,_fmt::v10::detail::dragonbox::decimal_fp<float>,_char,_fmt::v10::detail::digit_grouping<char>_>
           ::anon_class_28_8_ad0ecca5::operator()
                     ((anon_class_28_8_ad0ecca5 *)CONCAT44(uVar8,iVar4),
                      in_stack_fffffffffffffdb8.container);
      local_8.container =
           (buffer<char> *)
           base_iterator<fmt::v10::appender>(local_a8.container,(appender)local_b0.container);
    }
    else {
      local_a0 = local_10.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
      out_00.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._4_4_ =
           in_stack_fffffffffffffd8c;
      out_00.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._0_4_ =
           in_stack_fffffffffffffd88;
      local_8.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_&>
                     (out_00,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                      (anon_class_28_8_ad0ecca5 *)
                      CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    }
  }
  else {
    local_bc = local_28[1] + local_38;
    if ((int)local_28[1] < 0) {
      if (local_bc < 1) {
        local_204 = -local_bc;
        if (((local_38 == 0) && (-1 < local_18.precision)) && (local_18.precision < local_204)) {
          local_204 = local_18.precision;
        }
        uVar6 = (undefined3)in_stack_fffffffffffffd74;
        uVar7 = CONCAT13(1,uVar6);
        if ((local_204 == 0) && (uVar7 = CONCAT13(1,uVar6), local_38 == 0)) {
          uVar7 = CONCAT13((char)((uint)local_18._4_4_ >> 0x13),uVar6) & 0x1ffffff;
        }
        iVar4 = ((char)(uVar7 >> 0x18) != '\0') + 1;
        tVar3 = to_unsigned<int>(0);
        local_48 = (iVar4 + tVar3) + local_48;
        out_03.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._4_4_ =
             in_stack_fffffffffffffd8c;
        out_03.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._0_4_ =
             in_stack_fffffffffffffd88;
        local_8.container =
             (buffer<char> *)
             write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_>
                       (out_03,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                        (anon_class_56_7_162c6e41 *)CONCAT44(uVar7,iVar4));
      }
      else {
        if (((uint)local_18._4_4_ >> 0x13 & 1) == 0) {
          local_26c = 0;
        }
        else {
          local_26c = local_18.precision - local_38;
        }
        local_16c = local_26c;
        tVar3 = to_unsigned<int>(0);
        local_48 = local_48 + (tVar3 + 1);
        specs_00 = local_1b0;
        digit_grouping<char>::digit_grouping
                  ((digit_grouping<char> *)in_stack_fffffffffffffdb8.container,
                   in_stack_fffffffffffffdc0,SUB41((uint)uVar8 >> 0x18,0));
        iVar4 = digit_grouping<char>::count_separators(in_stack_fffffffffffffda0,iVar4);
        tVar3 = to_unsigned<int>(0);
        local_48 = local_48 + tVar3;
        out_02.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._4_4_ = iVar4;
        out_02.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._0_4_ =
             in_stack_fffffffffffffd88;
        local_8.container =
             (buffer<char> *)
             write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_>
                       (out_02,specs_00,in_stack_fffffffffffffd78,
                        (anon_class_64_8_e6ffa566 *)
                        CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
        digit_grouping<char>::~digit_grouping
                  ((digit_grouping<char> *)
                   CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
      }
    }
    else {
      tVar3 = to_unsigned<int>(0);
      localized = (undefined1)((uint)uVar8 >> 0x18);
      local_48 = tVar3 + local_48;
      local_c0 = local_18.precision - local_bc;
      abort_fuzzing_if(false);
      if (((uint)local_18._4_4_ >> 0x13 & 1) != 0) {
        local_48 = local_48 + 1;
        if ((local_c0 < 1) && (local_18._4_1_ != '\x02')) {
          local_c0 = 0;
        }
        if (0 < local_c0) {
          tVar3 = to_unsigned<int>(0);
          local_48 = tVar3 + local_48;
        }
      }
      local_108 = local_20;
      this = &local_100;
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)in_stack_fffffffffffffdb8.container,
                 in_stack_fffffffffffffdc0,(bool)localized);
      digit_grouping<char>::count_separators(this,iVar4);
      tVar3 = to_unsigned<int>(0);
      local_48 = local_48 + tVar3;
      local_120 = local_10.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
      local_168 = local_3a;
      local_160 = &local_34;
      local_158 = &local_38;
      local_150 = local_28;
      local_148 = &local_100;
      local_140 = &local_18;
      local_138 = &local_49;
      local_130 = &local_c0;
      local_128 = local_3a + 1;
      out_01.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._4_4_ =
           in_stack_fffffffffffffd8c;
      out_01.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._0_4_ =
           in_stack_fffffffffffffd88;
      local_8.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_>
                     (out_01,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                      (anon_class_72_9_0c6a3a8a *)
                      CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
      digit_grouping<char>::~digit_grouping
                ((digit_grouping<char> *)
                 CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    }
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)local_8.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}